

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O2

void Omega_h::transfer_common2<int>
               (Mesh *old_mesh,Mesh *new_mesh,Int ent_dim,LOs *same_ents2old_ents,
               LOs *same_ents2new_ents,TagBase *tagbase,Write<int> *new_data)

{
  Int width;
  Read<int> same_data;
  Read<int> old_data;
  Write<int> local_c0;
  Write<int> local_b0;
  Write<int> local_a0;
  Write<int> local_90;
  Write<int> local_80;
  Write<int> local_70;
  Write<int> local_60;
  Write<int> local_50;
  
  TagBase::name_abi_cxx11_(tagbase);
  width = TagBase::ncomps(tagbase);
  Mesh::get_array<int>
            ((Mesh *)&stack0xffffffffffffffc0,(Int)old_mesh,(string *)(ulong)(uint)ent_dim);
  Write<int>::Write(&local_70,&same_ents2old_ents->write_);
  Write<int>::Write(&local_80,(Write<int> *)&stack0xffffffffffffffc0);
  unmap<int>((Omega_h *)&local_60,(LOs *)&local_70,(Read<int> *)&local_80,width);
  read<int>((Omega_h *)&local_50,&local_60);
  Write<int>::~Write(&local_60);
  Write<int>::~Write(&local_80);
  Write<int>::~Write(&local_70);
  Write<int>::Write(&local_90,&local_50);
  Write<int>::Write(&local_a0,&same_ents2new_ents->write_);
  Write<int>::Write(&local_b0,new_data);
  map_into<int>((Read<int> *)&local_90,(LOs *)&local_a0,&local_b0,width);
  Write<int>::~Write(&local_b0);
  Write<int>::~Write(&local_a0);
  Write<int>::~Write(&local_90);
  Write<int>::Write(&local_c0,new_data);
  transfer_common3<int>(new_mesh,ent_dim,tagbase,&local_c0);
  Write<int>::~Write(&local_c0);
  Write<int>::~Write(&local_50);
  Write<int>::~Write((Write<int> *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void transfer_common2(Mesh* old_mesh, Mesh* new_mesh, Int ent_dim,
    LOs same_ents2old_ents, LOs same_ents2new_ents, TagBase const* tagbase,
    Write<T> new_data) {
  auto const& name = tagbase->name();
  auto ncomps = tagbase->ncomps();
  auto old_data = old_mesh->get_array<T>(ent_dim, name);
  auto same_data = read(unmap(same_ents2old_ents, old_data, ncomps));
  map_into(same_data, same_ents2new_ents, new_data, ncomps);
  transfer_common3(new_mesh, ent_dim, tagbase, new_data);
}